

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O2

bool __thiscall mnf::Manifold::isInM(Manifold *this,VectorXd *val,double prec)

{
  long lVar1;
  uint __line;
  int iVar2;
  Index IVar3;
  char *__assertion;
  
  if ((this->super_ValidManifold).flag_ == 0x677d7257) {
    lVar1 = (val->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    IVar3 = representationDim(this);
    if (lVar1 == IVar3) {
      iVar2 = (*this->_vptr_Manifold[0xd])(prec,this,val);
      return SUB41(iVar2,0);
    }
    __assertion = "val.size() == representationDim()";
    __line = 0x41;
  }
  else {
    puts(
        "It appears that you\'re trying to call a method from a manifold that does not exist              anymore. Possible cause: the manifold was statically created in a scope (e.g. a function) which was              left since then. For Stan: https://www.youtube.com/watch?v=Yy8MUnlT9Oo"
        );
    __assertion = "isValid() || seeMessageAbove()";
    __line = 0x40;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                ,__line,"virtual bool mnf::Manifold::isInM(const Eigen::VectorXd &, double) const");
}

Assistant:

bool Manifold::isInM(const Eigen::VectorXd& val, double prec) const
{
  mnf_assert(isValid() || seeMessageAbove());
  mnf_assert(val.size() == representationDim());
  return isInM_(val, prec);
}